

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QSize __thiscall QDockWidgetGroupLayout::maximumSize(QDockWidgetGroupLayout *this)

{
  int iVar1;
  QSize QVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int fw;
  QSize *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QSize local_18;
  QSize local_10;
  QDockAreaLayoutInfo *this_00;
  
  this_00 = *(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28);
  iVar1 = frameWidth((QDockWidgetGroupLayout *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  local_10 = QDockAreaLayoutInfo::maximumSize(this_00);
  QSize::QSize(&local_18,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QVar2 = ::operator+((QSize *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  if (*(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28) == this_00) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize maximumSize() const override
    {
        int fw = frameWidth();
        return layoutState.maximumSize() + QSize(fw, fw);
    }